

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boolean.h
# Opt level: O1

string * __thiscall Boolean::asString_abi_cxx11_(string *__return_storage_ptr__,Boolean *this)

{
  bool bVar1;
  char *pcVar2;
  
  bVar1 = this->value;
  pcVar2 = "false";
  if ((ulong)bVar1 != 0) {
    pcVar2 = "true";
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + ((ulong)bVar1 ^ 5));
  return __return_storage_ptr__;
}

Assistant:

std::string asString() override {
        return value ? "true" : "false";
    }